

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::XYZVisitor::XYZVisitor(XYZVisitor *this,SimInfo *info)

{
  undefined1 uVar1;
  SelectionManager *this_00;
  undefined8 in_RSI;
  allocator<char> *in_RDI;
  SelectionEvaluator *this_01;
  SimInfo *in_stack_00000058;
  SelectionEvaluator *in_stack_00000060;
  SimInfo *in_stack_00000208;
  SelectionManager *in_stack_00000210;
  undefined7 in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  SelectionEvaluator *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  string local_40 [48];
  undefined8 local_10;
  
  local_10 = in_RSI;
  BaseVisitor::BaseVisitor((BaseVisitor *)0x34c519);
  *(undefined ***)in_RDI = &PTR__XYZVisitor_00486280;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  this_01 = (SelectionEvaluator *)(in_RDI + 0x30);
  SelectionManager::SelectionManager(in_stack_00000210,in_stack_00000208);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000060,in_stack_00000058);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x34c57e);
  in_RDI[0x660] = (allocator<char>)0x1;
  in_RDI[0x661] = (allocator<char>)0x0;
  in_RDI[0x662] = (allocator<char>)0x0;
  in_RDI[0x663] = (allocator<char>)0x0;
  in_RDI[0x664] = (allocator<char>)0x0;
  in_RDI[0x665] = (allocator<char>)0x0;
  in_RDI[0x666] = (allocator<char>)0x0;
  *(undefined8 *)(in_RDI + 0x28) = local_10;
  std::__cxx11::string::operator=((string *)(in_RDI + 8),"XYZVisitor");
  this_00 = (SelectionManager *)(in_RDI + 0xf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,(char *)this_01,in_RDI);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xf8));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff68));
    SelectionSet::~SelectionSet((SelectionSet *)0x34c692);
  }
  return;
}

Assistant:

XYZVisitor::XYZVisitor(SimInfo* info) :
      BaseVisitor(), seleMan(info), evaluator(info), doPositions_(true),
      doVelocities_(false), doForces_(false), doVectors_(false),
      doCharges_(false), doElectricFields_(false), doGlobalIDs_(false) {
    this->info  = info;
    visitorName = "XYZVisitor";

    evaluator.loadScriptString("select all");

    if (!evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }